

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarantool_tcp.c
# Opt level: O1

int main(void)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  tnt_stream *ptVar7;
  tnt_stream *ptVar8;
  ssize_t sVar9;
  tnt_request *ptVar10;
  int64_t iVar11;
  int64_t iVar12;
  tnt_reply *ptVar13;
  tnt_iter *ptVar14;
  ulong uVar15;
  tnt_iter *ptVar16;
  mp_type *pmVar17;
  bool bVar18;
  long lVar19;
  ulong uVar20;
  byte *pbVar21;
  bool bVar22;
  byte *pbVar23;
  mp_type *pmVar24;
  byte *pbVar25;
  uint condition;
  undefined8 uStack_168;
  char uri [128];
  byte local_98;
  long local_90;
  byte *local_70;
  
  plan(0xb);
  uri[0x68] = '\0';
  uri[0x69] = '\0';
  uri[0x6a] = '\0';
  uri[0x6b] = '\0';
  uri[0x6c] = '\0';
  uri[0x6d] = '\0';
  uri[0x6e] = '\0';
  uri[0x6f] = '\0';
  uri[0x70] = '\0';
  uri[0x71] = '\0';
  uri[0x72] = '\0';
  uri[0x73] = '\0';
  uri[0x74] = '\0';
  uri[0x75] = '\0';
  uri[0x76] = '\0';
  uri[0x77] = '\0';
  uri[0x58] = '\0';
  uri[0x59] = '\0';
  uri[0x5a] = '\0';
  uri[0x5b] = '\0';
  uri[0x5c] = '\0';
  uri[0x5d] = '\0';
  uri[0x5e] = '\0';
  uri[0x5f] = '\0';
  uri[0x60] = '\0';
  uri[0x61] = '\0';
  uri[0x62] = '\0';
  uri[99] = '\0';
  uri[100] = '\0';
  uri[0x65] = '\0';
  uri[0x66] = '\0';
  uri[0x67] = '\0';
  uri[0x48] = '\0';
  uri[0x49] = '\0';
  uri[0x4a] = '\0';
  uri[0x4b] = '\0';
  uri[0x4c] = '\0';
  uri[0x4d] = '\0';
  uri[0x4e] = '\0';
  uri[0x4f] = '\0';
  uri[0x50] = '\0';
  uri[0x51] = '\0';
  uri[0x52] = '\0';
  uri[0x53] = '\0';
  uri[0x54] = '\0';
  uri[0x55] = '\0';
  uri[0x56] = '\0';
  uri[0x57] = '\0';
  uri[0x38] = '\0';
  uri[0x39] = '\0';
  uri[0x3a] = '\0';
  uri[0x3b] = '\0';
  uri[0x3c] = '\0';
  uri[0x3d] = '\0';
  uri[0x3e] = '\0';
  uri[0x3f] = '\0';
  uri[0x40] = '\0';
  uri[0x41] = '\0';
  uri[0x42] = '\0';
  uri[0x43] = '\0';
  uri[0x44] = '\0';
  uri[0x45] = '\0';
  uri[0x46] = '\0';
  uri[0x47] = '\0';
  uri[0x28] = '\0';
  uri[0x29] = '\0';
  uri[0x2a] = '\0';
  uri[0x2b] = '\0';
  uri[0x2c] = '\0';
  uri[0x2d] = '\0';
  uri[0x2e] = '\0';
  uri[0x2f] = '\0';
  uri[0x30] = '\0';
  uri[0x31] = '\0';
  uri[0x32] = '\0';
  uri[0x33] = '\0';
  uri[0x34] = '\0';
  uri[0x35] = '\0';
  uri[0x36] = '\0';
  uri[0x37] = '\0';
  uri[0x18] = '\0';
  uri[0x19] = '\0';
  uri[0x1a] = '\0';
  uri[0x1b] = '\0';
  uri[0x1c] = '\0';
  uri[0x1d] = '\0';
  uri[0x1e] = '\0';
  uri[0x1f] = '\0';
  uri[0x20] = '\0';
  uri[0x21] = '\0';
  uri[0x22] = '\0';
  uri[0x23] = '\0';
  uri[0x24] = '\0';
  uri[0x25] = '\0';
  uri[0x26] = '\0';
  uri[0x27] = '\0';
  uri[8] = '\0';
  uri[9] = '\0';
  uri[10] = '\0';
  uri[0xb] = '\0';
  uri[0xc] = '\0';
  uri[0xd] = '\0';
  uri[0xe] = '\0';
  uri[0xf] = '\0';
  uri[0x10] = '\0';
  uri[0x11] = '\0';
  uri[0x12] = '\0';
  uri[0x13] = '\0';
  uri[0x14] = '\0';
  uri[0x15] = '\0';
  uri[0x16] = '\0';
  uri[0x17] = '\0';
  uStack_168 = 0;
  uri[0] = '\0';
  uri[1] = '\0';
  uri[2] = '\0';
  uri[3] = '\0';
  uri[4] = '\0';
  uri[5] = '\0';
  uri[6] = '\0';
  uri[7] = '\0';
  pcVar6 = getenv("LISTEN");
  snprintf((char *)&uStack_168,0x80,"test:test@%s",pcVar6);
  plan(7);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_connect_tcp");
  fputc(10,_stdout);
  ptVar7 = tnt_net((tnt_stream *)0x0);
  iVar2 = __ok((uint)(ptVar7 != (tnt_stream *)0x0),"Checking that stream is allocated");
  if (iVar2 == 0) {
    main_cold_1();
  }
  iVar2 = __ok((uint)(ptVar7->alloc == 1),"Checking s->alloc");
  if (iVar2 == 0) {
    main_cold_2();
  }
  iVar2 = tnt_set(ptVar7,0,&uStack_168);
  iVar2 = __ok((uint)(iVar2 != -1),"Setting URI");
  if (iVar2 == 0) {
    main_cold_3();
  }
  iVar2 = tnt_connect(ptVar7);
  iVar2 = __ok((uint)(iVar2 != -1),"Connecting");
  if (iVar2 == 0) {
    main_cold_4();
  }
  tnt_close(ptVar7);
  tnt_stream_free(ptVar7);
  ptVar7 = (tnt_stream *)(uri + 0x78);
  uri[0x78] = '\0';
  uri[0x79] = '\0';
  uri[0x7a] = '\0';
  uri[0x7b] = '\0';
  uri[0x7c] = '\0';
  uri[0x7d] = '\0';
  uri[0x7e] = '\0';
  uri[0x7f] = '\0';
  tnt_net(ptVar7);
  iVar2 = __ok((uint)(uri._120_4_ == 0),"Checking sa.alloc");
  if (iVar2 == 0) {
    main_cold_5();
  }
  iVar2 = tnt_set((tnt_stream *)(uri + 0x78),0,&uStack_168);
  iVar2 = __ok((uint)(iVar2 != -1),"Setting URI");
  if (iVar2 == 0) {
    main_cold_6();
  }
  iVar2 = tnt_connect((tnt_stream *)(uri + 0x78));
  iVar2 = __ok((uint)(iVar2 != -1),"Connecting");
  if (iVar2 == 0) {
    main_cold_7();
  }
  tnt_close(ptVar7);
  tnt_stream_free(ptVar7);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_connect_tcp");
  fputc(10,_stdout);
  check_plan();
  test_object();
  plan(5);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_request_01");
  fputc(10,_stdout);
  ptVar7 = tnt_net((tnt_stream *)0x0);
  iVar2 = __ok((uint)(ptVar7 != (tnt_stream *)0x0),"Check connection creation");
  if (iVar2 == 0) {
    main_cold_8();
  }
  iVar2 = tnt_set(ptVar7,0,&uStack_168);
  iVar2 = __ok((uint)(iVar2 != -1),"Setting URI");
  if (iVar2 == 0) {
    main_cold_9();
  }
  iVar2 = tnt_connect(ptVar7);
  iVar2 = __ok((uint)(iVar2 != -1),"Connecting");
  if (iVar2 == 0) {
    main_cold_10();
  }
  ptVar8 = tnt_object((tnt_stream *)0x0);
  iVar2 = __ok((uint)(ptVar8 != (tnt_stream *)0x0),"Check object creation");
  if (iVar2 == 0) {
    main_cold_11();
  }
  sVar9 = tnt_object_add_array(ptVar8,0);
  iVar2 = __ok((uint)(sVar9 == 1),"Append elem");
  if (iVar2 == 0) {
    main_cold_12();
  }
  ptVar10 = tnt_request_call_16((tnt_request *)0x0);
  tnt_request_set_funcz(ptVar10,"test_4");
  tnt_request_set_tuple(ptVar10,ptVar8);
  iVar11 = tnt_request_compile(ptVar7,ptVar10);
  tnt_request_free(ptVar10);
  ptVar10 = tnt_request_eval((tnt_request *)0x0);
  tnt_request_set_exprz(ptVar10,"return test_4()");
  tnt_request_set_tuple(ptVar10,ptVar8);
  iVar12 = tnt_request_compile(ptVar7,ptVar10);
  tnt_request_free(ptVar10);
  tnt_flush(ptVar7);
  tnt_iter_reply((tnt_iter *)(uri + 0x78),ptVar7);
  while (iVar2 = tnt_next((tnt_iter *)(uri + 0x78)), iVar2 != 0) {
    if ((local_90 != iVar11) && (local_90 != iVar12)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                    ,0x112,"int test_request_01(char *)");
    }
  }
  tnt_stream_free(ptVar7);
  tnt_stream_free(ptVar8);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_request_01");
  fputc(10,_stdout);
  check_plan();
  plan(0xf);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_request_02");
  fputc(10,_stdout);
  ptVar7 = tnt_net((tnt_stream *)0x0);
  iVar2 = __ok((uint)(ptVar7 != (tnt_stream *)0x0),"Check connection creation");
  if (iVar2 == 0) {
    main_cold_13();
  }
  iVar2 = tnt_set(ptVar7,0,&uStack_168);
  iVar2 = __ok((uint)(iVar2 != -1),"Setting URI");
  if (iVar2 == 0) {
    main_cold_14();
  }
  iVar2 = tnt_connect(ptVar7);
  iVar2 = __ok((uint)(iVar2 != -1),"Connecting");
  if (iVar2 == 0) {
    main_cold_15();
  }
  ptVar8 = tnt_object((tnt_stream *)0x0);
  iVar2 = __ok((uint)(ptVar8 != (tnt_stream *)0x0),"Check object creation");
  if (iVar2 == 0) {
    main_cold_16();
  }
  sVar9 = tnt_object_add_array(ptVar8,1);
  iVar2 = __ok((uint)(sVar9 == 1),"Create key");
  if (iVar2 == 0) {
    main_cold_17();
  }
  sVar9 = tnt_object_add_strz(ptVar8,"_vspace");
  iVar2 = __ok((uint)(sVar9 == 8),"Create key");
  if (iVar2 == 0) {
    main_cold_18();
  }
  ptVar10 = tnt_request_select((tnt_request *)0x0);
  iVar2 = __ok((uint)(ptVar10 != (tnt_request *)0x0),"Check request creation");
  if (iVar2 == 0) {
    main_cold_19();
  }
  iVar2 = __ok((uint)((ptVar10->hdr).type == TNT_OP_SELECT),"Check that we inited select");
  if (iVar2 == 0) {
    main_cold_20();
  }
  iVar2 = tnt_request_set_space(ptVar10,0x119);
  iVar2 = __ok((uint)(iVar2 == 0),"Set space");
  if (iVar2 == 0) {
    main_cold_21();
  }
  iVar2 = tnt_request_set_index(ptVar10,2);
  iVar2 = __ok((uint)(iVar2 == 0),"Set index");
  if (iVar2 == 0) {
    main_cold_22();
  }
  iVar2 = tnt_request_set_key(ptVar10,ptVar8);
  iVar2 = __ok((uint)(iVar2 == 0),"Set key");
  if (iVar2 == 0) {
    main_cold_23();
  }
  iVar11 = tnt_request_compile(ptVar7,ptVar10);
  iVar2 = __ok((uint)(iVar11 != -1),"Compile request");
  if (iVar2 == 0) {
    main_cold_24();
  }
  sVar9 = tnt_flush(ptVar7);
  iVar2 = __ok((uint)(sVar9 != -1),"Send package to server");
  if (iVar2 == 0) {
    main_cold_25();
  }
  tnt_request_free(ptVar10);
  tnt_stream_free(ptVar8);
  ptVar13 = tnt_reply_init((tnt_reply *)(uri + 0x78));
  iVar2 = __ok((uint)(ptVar13 != (tnt_reply *)0x0),"Init reply");
  if (iVar2 == 0) {
    main_cold_26();
  }
  iVar2 = (*ptVar7->read_reply)(ptVar7,(tnt_reply *)(uri + 0x78));
  iVar2 = __ok((uint)(iVar2 != -1),"Read reply");
  if (iVar2 == 0) {
    main_cold_27();
  }
  tnt_reply_free((tnt_reply *)(uri + 0x78));
  tnt_stream_free(ptVar7);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_request_02");
  fputc(10,_stdout);
  check_plan();
  plan(0xf);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_request_03");
  fputc(10,_stdout);
  ptVar7 = tnt_net((tnt_stream *)0x0);
  iVar2 = __ok((uint)(ptVar7 != (tnt_stream *)0x0),"Check connection creation");
  if (iVar2 == 0) {
    main_cold_28();
  }
  iVar2 = tnt_set(ptVar7,0,&uStack_168);
  iVar2 = __ok((uint)(iVar2 != -1),"Setting URI");
  if (iVar2 == 0) {
    main_cold_29();
  }
  iVar2 = tnt_connect(ptVar7);
  iVar2 = __ok((uint)(iVar2 != -1),"Connecting");
  if (iVar2 == 0) {
    main_cold_30();
  }
  ptVar8 = tnt_object((tnt_stream *)0x0);
  iVar2 = __ok((uint)(ptVar8 != (tnt_stream *)0x0),"Check object creation");
  if (iVar2 == 0) {
    main_cold_31();
  }
  sVar9 = tnt_object_add_array(ptVar8,1);
  iVar2 = __ok((uint)(sVar9 == 1),"Create key");
  if (iVar2 == 0) {
    main_cold_32();
  }
  sVar9 = tnt_object_add_strz(ptVar8,"_vspace");
  iVar2 = __ok((uint)(sVar9 == 8),"Create key");
  if (iVar2 == 0) {
    main_cold_33();
  }
  ptVar10 = tnt_request_select((tnt_request *)0x0);
  iVar2 = __ok((uint)(ptVar10 != (tnt_request *)0x0),"Check request creation");
  if (iVar2 == 0) {
    main_cold_34();
  }
  uVar5 = 0;
  iVar2 = __ok((uint)((ptVar10->hdr).type == TNT_OP_SELECT),"Check that we inited select");
  if (iVar2 == 0) {
    main_cold_35();
  }
  uVar3 = tnt_get_spaceno(ptVar7,"_vspace",7);
  if (uVar3 != 0xffffffff) {
    iVar2 = tnt_request_set_space(ptVar10,uVar3);
    uVar5 = (uint)(iVar2 == 0);
  }
  iVar2 = __ok(uVar5,"Set space");
  if (iVar2 == 0) {
    main_cold_36();
  }
  iVar2 = tnt_request_set_sindex(ptVar7,ptVar10,"name",4);
  iVar2 = __ok((uint)(iVar2 == 0),"Set index");
  if (iVar2 == 0) {
    main_cold_37();
  }
  iVar2 = tnt_request_set_key(ptVar10,ptVar8);
  iVar2 = __ok((uint)(iVar2 == 0),"Set key");
  if (iVar2 == 0) {
    main_cold_38();
  }
  iVar11 = tnt_request_compile(ptVar7,ptVar10);
  iVar2 = __ok((uint)(iVar11 != -1),"Compile request");
  if (iVar2 == 0) {
    main_cold_39();
  }
  sVar9 = tnt_flush(ptVar7);
  iVar2 = __ok((uint)(sVar9 != -1),"Send package to server");
  if (iVar2 == 0) {
    main_cold_40();
  }
  tnt_request_free(ptVar10);
  tnt_stream_free(ptVar8);
  ptVar13 = tnt_reply_init((tnt_reply *)(uri + 0x78));
  iVar2 = __ok((uint)(ptVar13 != (tnt_reply *)0x0),"Init reply");
  if (iVar2 == 0) {
    main_cold_41();
  }
  iVar2 = (*ptVar7->read_reply)(ptVar7,(tnt_reply *)(uri + 0x78));
  iVar2 = __ok((uint)(iVar2 != -1),"Read reply");
  if (iVar2 == 0) {
    main_cold_42();
  }
  tnt_reply_free((tnt_reply *)(uri + 0x78));
  tnt_stream_free(ptVar7);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_request_03");
  fputc(10,_stdout);
  check_plan();
  plan(0x12);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_request_04");
  fputc(10,_stdout);
  ptVar7 = tnt_net((tnt_stream *)0x0);
  iVar2 = __ok((uint)(ptVar7 != (tnt_stream *)0x0),"Check connection creation");
  if (iVar2 == 0) {
    main_cold_43();
  }
  iVar2 = tnt_set(ptVar7,0,&uStack_168);
  iVar2 = __ok((uint)(iVar2 != -1),"Setting URI");
  if (iVar2 == 0) {
    main_cold_44();
  }
  iVar2 = tnt_connect(ptVar7);
  iVar2 = __ok((uint)(iVar2 != -1),"Connecting");
  if (iVar2 == 0) {
    main_cold_45();
  }
  ptVar8 = tnt_object((tnt_stream *)0x0);
  iVar2 = __ok((uint)(ptVar8 != (tnt_stream *)0x0),"Check object creation");
  if (iVar2 == 0) {
    main_cold_46();
  }
  sVar9 = tnt_object_add_array(ptVar8,1);
  iVar2 = __ok((uint)(sVar9 == 1),"Create key");
  if (iVar2 == 0) {
    main_cold_47();
  }
  sVar9 = tnt_object_add_strz(ptVar8,"_vspace");
  iVar2 = __ok((uint)(sVar9 == 8),"Create key");
  if (iVar2 == 0) {
    main_cold_48();
  }
  ptVar10 = tnt_request_select((tnt_request *)0x0);
  iVar2 = __ok((uint)(ptVar10 != (tnt_request *)0x0),"Check request creation");
  if (iVar2 == 0) {
    main_cold_49();
  }
  uVar5 = 0;
  iVar2 = __ok((uint)((ptVar10->hdr).type == TNT_OP_SELECT),"Check that we inited select");
  if (iVar2 == 0) {
    main_cold_50();
  }
  uVar3 = tnt_get_spaceno(ptVar7,"_vspace",7);
  if (uVar3 != 0xffffffff) {
    iVar2 = tnt_request_set_space(ptVar10,uVar3);
    uVar5 = (uint)(iVar2 == 0);
  }
  iVar2 = __ok(uVar5,"Set space");
  if (iVar2 == 0) {
    main_cold_51();
  }
  iVar2 = tnt_request_set_sindex(ptVar7,ptVar10,"name",4);
  iVar2 = __ok((uint)(iVar2 == 0),"Set index");
  if (iVar2 == 0) {
    main_cold_52();
  }
  iVar2 = tnt_request_set_key(ptVar10,ptVar8);
  iVar2 = __ok((uint)(iVar2 == 0),"Set key");
  if (iVar2 == 0) {
    main_cold_53();
  }
  iVar2 = tnt_request_set_offset(ptVar10,1);
  iVar2 = __ok((uint)(iVar2 == 0),"Set offset");
  if (iVar2 == 0) {
    main_cold_54();
  }
  iVar2 = tnt_request_set_limit(ptVar10,1);
  iVar2 = __ok((uint)(iVar2 == 0),"Set limit");
  if (iVar2 == 0) {
    main_cold_55();
  }
  iVar2 = tnt_request_set_iterator(ptVar10,TNT_ITER_GT);
  iVar2 = __ok((uint)(iVar2 == 0),"Set iterator");
  if (iVar2 == 0) {
    main_cold_56();
  }
  iVar11 = tnt_request_compile(ptVar7,ptVar10);
  iVar2 = __ok((uint)(iVar11 != -1),"Compile request");
  if (iVar2 == 0) {
    main_cold_57();
  }
  sVar9 = tnt_flush(ptVar7);
  iVar2 = __ok((uint)(sVar9 != -1),"Send package to server");
  if (iVar2 == 0) {
    main_cold_58();
  }
  tnt_request_free(ptVar10);
  tnt_stream_free(ptVar8);
  ptVar13 = tnt_reply_init((tnt_reply *)(uri + 0x78));
  iVar2 = __ok((uint)(ptVar13 != (tnt_reply *)0x0),"Init reply");
  if (iVar2 == 0) {
    main_cold_59();
  }
  iVar2 = (*ptVar7->read_reply)(ptVar7,(tnt_reply *)(uri + 0x78));
  iVar2 = __ok((uint)(iVar2 != -1),"Read reply");
  if (iVar2 == 0) {
    main_cold_60();
  }
  tnt_reply_free((tnt_reply *)(uri + 0x78));
  tnt_stream_free(ptVar7);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_request_04");
  fputc(10,_stdout);
  check_plan();
  test_request_05((char *)&uStack_168);
  plan(0x20);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_msgpack_array_iter");
  fputc(10,_stdout);
  ptVar7 = tnt_object((tnt_stream *)0x0);
  sVar9 = tnt_object_format(ptVar7,"[%s%d%s%d]","hello",0xb,"world",0xc);
  iVar2 = __ok((uint)(sVar9 != -1),"Pack with format sa");
  if (iVar2 == 0) {
    main_cold_61();
  }
  ptVar14 = tnt_iter_array_object((tnt_iter *)0x0,ptVar7);
  iVar2 = __ok((uint)(ptVar14 != (tnt_iter *)0x0),"check allocation");
  if (iVar2 == 0) {
    main_cold_62();
  }
  iVar2 = tnt_next(ptVar14);
  if (iVar2 != 0) {
    uVar20 = 0;
    do {
      if (uVar20 < 4) {
        pbVar21 = (byte *)(ptVar14->data).array.elem;
        switch(uVar20) {
        case 0:
          iVar2 = __ok((uint)(mp_type_hint[*pbVar21] == MP_STR),"check str type");
          if (iVar2 == 0) {
            main_cold_73();
          }
          bVar1 = *pbVar21;
          if (bVar1 == 0xdb) {
            uVar5 = *(uint *)(pbVar21 + 1);
            uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
            pbVar25 = pbVar21 + 5;
          }
          else if (bVar1 == 0xda) {
            pbVar25 = pbVar21 + 3;
            uVar5 = (uint)(ushort)(*(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8);
          }
          else if (bVar1 == 0xd9) {
            uVar5 = (uint)pbVar21[1];
            pbVar25 = pbVar21 + 2;
          }
          else {
            if ((byte)(bVar1 + 0x40) < 0xe0) goto LAB_00110e2f;
            pbVar25 = pbVar21 + 1;
            uVar5 = bVar1 & 0x1f;
          }
          iVar2 = strncmp((char *)pbVar25,"hello",5);
          iVar2 = __ok((uint)(iVar2 == 0),"check str value");
          if (iVar2 == 0) {
            main_cold_74();
          }
          iVar2 = __ok((uint)(uVar5 == 5),"check string length");
          if (iVar2 == 0) {
            main_cold_75();
LAB_0010f942:
            main_cold_78();
          }
          break;
        case 1:
          iVar2 = __ok((uint)(mp_type_hint[*pbVar21] == MP_UINT),"check int type");
          if (iVar2 == 0) {
            main_cold_70();
          }
          bVar1 = *pbVar21;
          uVar15 = (ulong)bVar1;
          switch(bVar1) {
          case 0xcc:
            uVar15 = (ulong)pbVar21[1];
            break;
          case 0xcd:
            uVar15 = (ulong)(ushort)(*(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8);
            break;
          case 0xce:
            uVar5 = *(uint *)(pbVar21 + 1);
            uVar15 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                            uVar5 << 0x18);
            break;
          case 0xcf:
            uVar15 = *(ulong *)(pbVar21 + 1);
            uVar15 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                     (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                     (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                     (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38;
            break;
          default:
            if ((char)bVar1 < '\0') goto LAB_00110e34;
          }
          iVar2 = __ok((uint)(uVar15 == 0xb),"check int");
          if (iVar2 == 0) {
            main_cold_71();
            goto LAB_0010f942;
          }
          break;
        case 2:
          iVar2 = __ok((uint)(mp_type_hint[*pbVar21] == MP_STR),"check str type");
          if (iVar2 == 0) {
            main_cold_66();
          }
          bVar1 = *pbVar21;
          if (bVar1 == 0xdb) {
            uVar5 = *(uint *)(pbVar21 + 1);
            uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
            pbVar25 = pbVar21 + 5;
          }
          else if (bVar1 == 0xda) {
            pbVar25 = pbVar21 + 3;
            uVar5 = (uint)(ushort)(*(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8);
          }
          else if (bVar1 == 0xd9) {
            uVar5 = (uint)pbVar21[1];
            pbVar25 = pbVar21 + 2;
          }
          else {
            if ((byte)(bVar1 + 0x40) < 0xe0) goto LAB_00110e2a;
            pbVar25 = pbVar21 + 1;
            uVar5 = bVar1 & 0x1f;
          }
          iVar2 = strncmp((char *)pbVar25,"world",5);
          iVar2 = __ok((uint)(iVar2 == 0),"check str value");
          if (iVar2 == 0) {
            main_cold_67();
          }
          iVar2 = __ok((uint)(uVar5 == 5),"check string length");
          if (iVar2 == 0) {
            main_cold_68();
            goto LAB_0010f942;
          }
          break;
        case 3:
          iVar2 = __ok((uint)(mp_type_hint[*pbVar21] == MP_UINT),"check int type");
          if (iVar2 == 0) {
            main_cold_63();
          }
          bVar1 = *pbVar21;
          uVar15 = (ulong)bVar1;
          switch(bVar1) {
          case 0xcc:
            uVar15 = (ulong)pbVar21[1];
            break;
          case 0xcd:
            uVar15 = (ulong)(ushort)(*(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8);
            break;
          case 0xce:
            uVar5 = *(uint *)(pbVar21 + 1);
            uVar15 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                            uVar5 << 0x18);
            break;
          case 0xcf:
            uVar15 = *(ulong *)(pbVar21 + 1);
            uVar15 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                     (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                     (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                     (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38;
            break;
          default:
            if ((char)bVar1 < '\0') goto LAB_00110e39;
          }
          iVar2 = __ok((uint)(uVar15 == 0xc),"check int");
          if (iVar2 == 0) {
            main_cold_64();
            goto LAB_0010f942;
          }
        }
      }
      else {
        iVar2 = __ok(0,"unreacheable section");
        if (iVar2 == 0) {
          main_cold_77();
          goto LAB_0010f942;
        }
      }
      uVar20 = uVar20 + 1;
      iVar2 = tnt_next(ptVar14);
    } while (iVar2 != 0);
  }
  tnt_iter_free(ptVar14);
  tnt_stream_free(ptVar7);
  ptVar7 = tnt_object((tnt_stream *)0x0);
  sVar9 = tnt_object_format(ptVar7,"[[%d%d] [%d%d] [%d%d]]",1,2,3,4,5,6);
  iVar2 = __ok((uint)(sVar9 != -1),"Pack with format aofa");
  if (iVar2 == 0) {
    main_cold_79();
  }
  ptVar14 = tnt_iter_array_object((tnt_iter *)0x0,ptVar7);
  iVar2 = __ok((uint)(ptVar14 != (tnt_iter *)0x0),"check allocation");
  if (iVar2 == 0) {
    main_cold_80();
  }
  iVar2 = tnt_next(ptVar14);
  if (iVar2 != 0) {
    pmVar24 = (mp_type *)0x1;
    do {
      pbVar21 = (byte *)(ptVar14->data).array.elem;
      pcVar6 = (ptVar14->data).array.elem_end;
      iVar2 = __ok((uint)(mp_type_hint[*pbVar21] == MP_ARRAY),"check for array");
      if (iVar2 == 0) {
        main_cold_81();
      }
      ptVar16 = tnt_iter_array((tnt_iter *)0x0,(char *)pbVar21,(long)pcVar6 - (long)pbVar21);
      iVar2 = __ok((uint)(ptVar16 != (tnt_iter *)0x0),"check allocation");
      if (iVar2 == 0) {
        main_cold_82();
      }
      while (iVar2 = tnt_next(ptVar16), iVar2 != 0) {
        pbVar21 = (byte *)(ptVar16->data).array.elem;
        iVar2 = __ok((uint)(mp_type_hint[*pbVar21] == MP_UINT),"check int type");
        if (iVar2 == 0) {
          main_cold_83();
        }
        bVar1 = *pbVar21;
        pmVar17 = (mp_type *)(ulong)bVar1;
        switch(bVar1) {
        case 0xcc:
          pmVar17 = (mp_type *)(ulong)pbVar21[1];
          break;
        case 0xcd:
          pmVar17 = (mp_type *)
                    (ulong)(ushort)(*(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8);
          break;
        case 0xce:
          uVar5 = *(uint *)(pbVar21 + 1);
          pmVar17 = (mp_type *)
                    (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                           uVar5 << 0x18);
          break;
        case 0xcf:
          uVar20 = *(ulong *)(pbVar21 + 1);
          pmVar17 = (mp_type *)
                    (uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                     (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                     (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                     (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38);
          break;
        default:
          if ((char)bVar1 < '\0') {
            main_cold_85();
            goto LAB_00110ddf;
          }
        }
        iVar2 = __ok((uint)(pmVar24 == pmVar17),"check int");
        if (iVar2 == 0) {
          main_cold_84();
        }
        pmVar24 = (mp_type *)((long)pmVar24 + 1);
      }
      tnt_iter_free(ptVar16);
      iVar2 = tnt_next(ptVar14);
    } while (iVar2 != 0);
  }
  tnt_iter_free(ptVar14);
  tnt_stream_free(ptVar7);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_msgpack_array_iter");
  fputc(10,_stdout);
  check_plan();
  plan(0x22);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_msgpack_mapa_iter");
  fputc(10,_stdout);
  ptVar7 = tnt_object((tnt_stream *)0x0);
  iVar2 = __ok((uint)(ptVar7 != (tnt_stream *)0x0),"check allocation");
  if (iVar2 == 0) {
    main_cold_86();
  }
  sVar9 = tnt_object_format(ptVar7,"{%s%d%s%d}","hello",0xb,"world",0xc);
  iVar2 = __ok((uint)(sVar9 != -1),"Pack with format s,");
  if (iVar2 == 0) {
    main_cold_87();
  }
  ptVar14 = tnt_iter_map_object((tnt_iter *)0x0,ptVar7);
  iVar2 = __ok((uint)(ptVar14 != (tnt_iter *)0x0),"check allocation");
  if (iVar2 == 0) {
    main_cold_88();
  }
  iVar2 = tnt_next(ptVar14);
  if (iVar2 != 0) {
    lVar19 = 0;
    do {
      pbVar21 = (byte *)(ptVar14->data).array.elem;
      pbVar25 = (byte *)(ptVar14->data).map.value;
      if (lVar19 == 1) {
        iVar2 = __ok((uint)(mp_type_hint[*pbVar21] == MP_STR),"check str type");
        if (iVar2 == 0) {
          main_cold_89();
        }
        bVar1 = *pbVar21;
        if (bVar1 == 0xdb) {
          uVar5 = *(uint *)(pbVar21 + 1);
          uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          pbVar23 = pbVar21 + 5;
        }
        else if (bVar1 == 0xda) {
          pbVar23 = pbVar21 + 3;
          uVar5 = (uint)(ushort)(*(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8);
        }
        else if (bVar1 == 0xd9) {
          uVar5 = (uint)pbVar21[1];
          pbVar23 = pbVar21 + 2;
        }
        else {
          if ((byte)(bVar1 + 0x40) < 0xe0) goto LAB_00110e16;
          pbVar23 = pbVar21 + 1;
          uVar5 = bVar1 & 0x1f;
        }
        iVar2 = strncmp((char *)pbVar23,"world",5);
        iVar2 = __ok((uint)(iVar2 == 0),"check str value");
        if (iVar2 == 0) {
          main_cold_90();
        }
        iVar2 = __ok((uint)(uVar5 == 5),"check string length");
        if (iVar2 == 0) {
          main_cold_91();
        }
        iVar2 = __ok((uint)(mp_type_hint[*pbVar25] == MP_UINT),"check int type");
        if (iVar2 == 0) {
          main_cold_92();
        }
        bVar1 = *pbVar25;
        uVar20 = (ulong)bVar1;
        switch(bVar1) {
        case 0xcc:
          uVar20 = (ulong)pbVar25[1];
          break;
        case 0xcd:
          uVar20 = (ulong)(ushort)(*(ushort *)(pbVar25 + 1) << 8 | *(ushort *)(pbVar25 + 1) >> 8);
          break;
        case 0xce:
          uVar5 = *(uint *)(pbVar25 + 1);
          uVar20 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                          uVar5 << 0x18);
          break;
        case 0xcf:
          uVar20 = *(ulong *)(pbVar25 + 1);
          uVar20 = uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                   (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                   (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                   (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38;
          break;
        default:
          if ((char)bVar1 < '\0') goto LAB_00110e20;
        }
        iVar2 = __ok((uint)(uVar20 == 0xc),"check int");
        if (iVar2 == 0) {
          main_cold_93();
          goto LAB_001100cc;
        }
      }
      else if (lVar19 == 0) {
        iVar2 = __ok((uint)(mp_type_hint[*pbVar21] == MP_STR),"check str type");
        if (iVar2 == 0) {
          main_cold_96();
        }
        bVar1 = *pbVar21;
        if (bVar1 == 0xdb) {
          uVar5 = *(uint *)(pbVar21 + 1);
          uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          pbVar23 = pbVar21 + 5;
        }
        else if (bVar1 == 0xda) {
          pbVar23 = pbVar21 + 3;
          uVar5 = (uint)(ushort)(*(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8);
        }
        else if (bVar1 == 0xd9) {
          uVar5 = (uint)pbVar21[1];
          pbVar23 = pbVar21 + 2;
        }
        else {
          if ((byte)(bVar1 + 0x40) < 0xe0) goto LAB_00110e1b;
          pbVar23 = pbVar21 + 1;
          uVar5 = bVar1 & 0x1f;
        }
        iVar2 = strncmp((char *)pbVar23,"hello",5);
        iVar2 = __ok((uint)(iVar2 == 0),"check str value");
        if (iVar2 == 0) {
          main_cold_97();
        }
        iVar2 = __ok((uint)(uVar5 == 5),"check string length");
        if (iVar2 == 0) {
          main_cold_98();
        }
        iVar2 = __ok((uint)(mp_type_hint[*pbVar25] == MP_UINT),"check int type");
        if (iVar2 == 0) {
          main_cold_99();
        }
        bVar1 = *pbVar25;
        uVar20 = (ulong)bVar1;
        switch(bVar1) {
        case 0xcc:
          uVar20 = (ulong)pbVar25[1];
          break;
        case 0xcd:
          uVar20 = (ulong)(ushort)(*(ushort *)(pbVar25 + 1) << 8 | *(ushort *)(pbVar25 + 1) >> 8);
          break;
        case 0xce:
          uVar5 = *(uint *)(pbVar25 + 1);
          uVar20 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                          uVar5 << 0x18);
          break;
        case 0xcf:
          uVar20 = *(ulong *)(pbVar25 + 1);
          uVar20 = uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                   (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                   (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                   (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38;
          break;
        default:
          if ((char)bVar1 < '\0') goto LAB_00110e25;
        }
        iVar2 = __ok((uint)(uVar20 == 0xb),"check int");
        if (iVar2 == 0) {
          main_cold_100();
LAB_001100cc:
          main_cold_104();
        }
      }
      else {
        iVar2 = __ok(0,"unreacheable section");
        if (iVar2 == 0) {
          main_cold_103();
          goto LAB_001100cc;
        }
      }
      lVar19 = lVar19 + 1;
      iVar2 = tnt_next(ptVar14);
    } while (iVar2 != 0);
  }
  tnt_iter_free(ptVar14);
  tnt_stream_free(ptVar7);
  ptVar7 = tnt_object((tnt_stream *)0x0);
  iVar2 = __ok((uint)(ptVar7 != (tnt_stream *)0x0),"check allocation");
  if (iVar2 == 0) {
    main_cold_105();
  }
  sVar9 = tnt_object_format(ptVar7,"{%s [%d%d] %s [%d%d]}","hello",0,1,"world",2,3);
  iVar2 = __ok((uint)(sVar9 != -1),"Pack with format aofa");
  if (iVar2 == 0) {
    main_cold_106();
  }
  ptVar14 = tnt_iter_map_object((tnt_iter *)0x0,ptVar7);
  iVar2 = __ok((uint)(ptVar14 != (tnt_iter *)0x0),"check allocation");
  if (iVar2 == 0) {
    main_cold_107();
  }
  iVar2 = tnt_next(ptVar14);
  if (iVar2 != 0) {
    pmVar24 = mp_type_hint;
    pbVar21 = (byte *)0x0;
    do {
      pbVar25 = (byte *)(ptVar14->data).array.elem;
      iVar2 = __ok((uint)(mp_type_hint[*pbVar25] == MP_STR),"check str type");
      if (pbVar21 == (byte *)0x0) {
        if (iVar2 == 0) {
          main_cold_111();
        }
        bVar1 = *pbVar25;
        if (bVar1 == 0xdb) {
          uVar5 = *(uint *)(pbVar25 + 1);
          uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          pbVar23 = pbVar25 + 5;
        }
        else if (bVar1 == 0xda) {
          pbVar23 = pbVar25 + 3;
          uVar5 = (uint)(ushort)(*(ushort *)(pbVar25 + 1) << 8 | *(ushort *)(pbVar25 + 1) >> 8);
        }
        else if (bVar1 == 0xd9) {
          uVar5 = (uint)pbVar25[1];
          pbVar23 = pbVar25 + 2;
        }
        else {
          if ((byte)(bVar1 + 0x40) < 0xe0) goto LAB_00110e11;
          pbVar23 = pbVar25 + 1;
          uVar5 = bVar1 & 0x1f;
        }
        iVar2 = strncmp((char *)pbVar23,"hello",5);
        iVar2 = __ok((uint)(iVar2 == 0),"check str value");
        if (iVar2 == 0) {
          main_cold_112();
        }
        iVar2 = __ok((uint)(uVar5 == 5),"check string length");
      }
      else {
        if (iVar2 == 0) {
          main_cold_108();
        }
        bVar1 = *pbVar25;
        if (bVar1 == 0xdb) {
          uVar5 = *(uint *)(pbVar25 + 1);
          uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          pbVar23 = pbVar25 + 5;
        }
        else if (bVar1 == 0xda) {
          pbVar23 = pbVar25 + 3;
          uVar5 = (uint)(ushort)(*(ushort *)(pbVar25 + 1) << 8 | *(ushort *)(pbVar25 + 1) >> 8);
        }
        else if (bVar1 == 0xd9) {
          uVar5 = (uint)pbVar25[1];
          pbVar23 = pbVar25 + 2;
        }
        else {
          if ((byte)(bVar1 + 0x40) < 0xe0) {
            main_cold_110();
LAB_00110e11:
            main_cold_119();
LAB_00110e16:
            main_cold_95();
LAB_00110e1b:
            main_cold_102();
LAB_00110e20:
            main_cold_94();
LAB_00110e25:
            main_cold_101();
LAB_00110e2a:
            main_cold_69();
LAB_00110e2f:
            main_cold_76();
LAB_00110e34:
            main_cold_72();
LAB_00110e39:
            main_cold_65();
            goto LAB_00110e3e;
          }
          pbVar23 = pbVar25 + 1;
          uVar5 = bVar1 & 0x1f;
        }
        iVar2 = strncmp((char *)pbVar23,"world",5);
        iVar2 = __ok((uint)(iVar2 == 0),"check str value");
        if (iVar2 == 0) {
          main_cold_109();
        }
        iVar2 = __ok((uint)(uVar5 == 5),"check string length");
      }
      if (iVar2 == 0) {
        main_cold_113();
      }
      pbVar25 = (byte *)(ptVar14->data).map.value;
      pcVar6 = (ptVar14->data).map.value_end;
      iVar2 = __ok((uint)(mp_type_hint[*pbVar25] == MP_ARRAY),"check for array");
      if (iVar2 == 0) {
        main_cold_114();
      }
      ptVar16 = tnt_iter_array((tnt_iter *)0x0,(char *)pbVar25,(long)pcVar6 - (long)pbVar25);
      iVar2 = __ok((uint)(ptVar16 != (tnt_iter *)0x0),"check allocation");
      if (iVar2 == 0) {
        main_cold_115();
      }
      while (iVar2 = tnt_next(ptVar16), iVar2 != 0) {
        pbVar25 = (byte *)(ptVar16->data).array.elem;
        iVar2 = __ok((uint)(mp_type_hint[*pbVar25] == MP_UINT),"check int type");
        if (iVar2 == 0) {
          main_cold_116();
        }
        bVar1 = *pbVar25;
        pbVar23 = (byte *)(ulong)bVar1;
        switch(bVar1) {
        case 0xcc:
          pbVar23 = (byte *)(ulong)pbVar25[1];
          break;
        case 0xcd:
          pbVar23 = (byte *)(ulong)(ushort)(*(ushort *)(pbVar25 + 1) << 8 |
                                           *(ushort *)(pbVar25 + 1) >> 8);
          break;
        case 0xce:
          uVar5 = *(uint *)(pbVar25 + 1);
          pbVar23 = (byte *)(ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8
                                   | uVar5 << 0x18);
          break;
        case 0xcf:
          uVar20 = *(ulong *)(pbVar25 + 1);
          pbVar23 = (byte *)(uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                             (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                             (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                             (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38);
          break;
        default:
          if ((char)bVar1 < '\0') goto LAB_00110ddf;
        }
        iVar2 = __ok((uint)(pbVar21 == pbVar23),"check int");
        if (iVar2 == 0) {
          main_cold_117();
        }
        pbVar21 = pbVar21 + 1;
      }
      tnt_iter_free(ptVar16);
      iVar2 = tnt_next(ptVar14);
    } while (iVar2 != 0);
  }
  tnt_iter_free(ptVar14);
  tnt_stream_free(ptVar7);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: done ***","test_msgpack_mapa_iter");
  fputc(10,_stdout);
  check_plan();
  ptVar7 = tnt_net((tnt_stream *)0x0);
  if (ptVar7 == (tnt_stream *)0x0) {
    __assert_fail("tnt != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                  ,0x315,"int test_pushes(const char *)");
  }
  iVar2 = tnt_set(ptVar7,0,&uStack_168);
  if (iVar2 == -1) {
    __assert_fail("rv != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                  ,0x317,"int test_pushes(const char *)");
  }
  iVar2 = tnt_connect(ptVar7);
  if (iVar2 == -1) {
    __assert_fail("rv != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                  ,0x319,"int test_pushes(const char *)");
  }
  condition = 0;
  ptVar10 = tnt_request_call((tnt_request *)0x0);
  tnt_request_set_funcz(ptVar10,"test_5");
  tnt_request_compile(ptVar7,ptVar10);
  tnt_flush(ptVar7);
  tnt_iter_reply((tnt_iter *)(uri + 0x78),ptVar7);
  iVar2 = tnt_next((tnt_iter *)(uri + 0x78));
  if (iVar2 == 0) {
    bVar22 = true;
    uVar5 = 0;
  }
  else {
    bVar18 = false;
    bVar22 = true;
    iVar2 = 0;
    do {
      if (bVar18) {
        __assert_fail("ended == false",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                      ,0x326,"int test_pushes(const char *)");
      }
      if ((local_98 & 0x80) == 0) {
        bVar1 = *local_70;
        if (mp_type_hint[bVar1] != MP_ARRAY) {
          __assert_fail("mp_typeof(*pos) == MP_ARRAY",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                        ,0x32c,"int test_pushes(const char *)");
        }
        if ((bVar1 & 0x40) == 0) {
          pbVar21 = local_70 + 1;
          uVar5 = bVar1 & 0xf;
        }
        else if ((bVar1 & 1) == 0) {
          pbVar21 = local_70 + 3;
          uVar5 = (uint)(ushort)(*(ushort *)(local_70 + 1) << 8 | *(ushort *)(local_70 + 1) >> 8);
        }
        else {
          uVar5 = *(uint *)(local_70 + 1);
          uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          pbVar21 = local_70 + 5;
        }
        if (uVar5 != 1) {
          __assert_fail("len == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                        ,0x32e,"int test_pushes(const char *)");
        }
        bVar1 = *pbVar21;
        if (mp_type_hint[bVar1] != MP_BOOL) {
          __assert_fail("mp_typeof(*pos) == MP_BOOL",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                        ,0x32f,"int test_pushes(const char *)");
        }
        bVar18 = true;
        if (bVar1 == 0xc3) {
          bVar22 = true;
        }
        else {
          if (bVar1 != 0xc2) goto LAB_00110e5d;
          bVar22 = false;
        }
      }
      else {
        iVar2 = iVar2 + 1;
      }
      iVar4 = tnt_next((tnt_iter *)(uri + 0x78));
    } while (iVar4 != 0);
    condition = (uint)(iVar2 == 10);
    uVar5 = (uint)bVar18;
  }
  tnt_request_free(ptVar10);
  tnt_close(ptVar7);
  tnt_stream_free(ptVar7);
  plan(2);
  pmVar24 = (mp_type *)&stdout;
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_pushes");
  fputc(10,_stdout);
  if (bVar22) {
    iVar2 = __ok(condition,"Got 10 results");
    if (iVar2 == 0) goto LAB_00110de4;
    goto LAB_00110732;
  }
  iVar2 = __ok(1,"Skipping: server don\'t support pushes");
  if (iVar2 == 0) {
    main_cold_120();
  }
  iVar2 = __ok(1,"Skipping: server don\'t support pushes");
  if (iVar2 != 0) goto LAB_0011078c;
  main_cold_121();
LAB_00110e02:
  main_cold_124();
LAB_0011078c:
  __space(*(FILE **)pmVar24);
  fwrite("# ",2,1,*(FILE **)pmVar24);
  fprintf(*(FILE **)pmVar24,"*** %s: done ***","test_pushes");
  fputc(10,*(FILE **)pmVar24);
  check_plan();
  plan(0x14);
  __space(*(FILE **)pmVar24);
  fwrite("# ",2,1,*(FILE **)pmVar24);
  fprintf(*(FILE **)pmVar24,"*** %s: prep ***","test_object_format_uint");
  fputc(10,*(FILE **)pmVar24);
  ptVar7 = tnt_net((tnt_stream *)0x0);
  if (ptVar7 == (tnt_stream *)0x0) {
    __assert_fail("tnt != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                  ,0x36d,"int test_object_format_uint(const char *)");
  }
  pcVar6 = (char *)0x0;
  iVar2 = tnt_set(ptVar7,0,&uStack_168);
  if (iVar2 != 0) {
    __assert_fail("rc == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                  ,0x36f,"int test_object_format_uint(const char *)");
  }
  iVar2 = tnt_connect(ptVar7);
  if (iVar2 != 0) {
    __assert_fail("rc == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                  ,0x371,"int test_object_format_uint(const char *)");
  }
  call_helper(ptVar7,pcVar6,"[%hhu]",0xff);
  call_helper(ptVar7,pcVar6,"[%hu]",0xffff);
  call_helper(ptVar7,pcVar6,"[%u]",0xffffffff);
  call_helper(ptVar7,pcVar6,"[%lu]",0xffffffffffffffff);
  call_helper(ptVar7,pcVar6,"[%llu]",0xffffffffffffffff);
  tnt_flush(ptVar7);
  uVar20 = 0;
  do {
    __space(*(FILE **)pmVar24);
    fwrite("# ",2,1,*(FILE **)pmVar24);
    fprintf(*(FILE **)pmVar24,"*** verify %d response: prep ***",uVar20);
    fputc(10,*(FILE **)pmVar24);
    ptVar13 = tnt_reply_init((tnt_reply *)0x0);
    (*ptVar7->read_reply)(ptVar7,ptVar13);
    pbVar21 = (byte *)ptVar13->data;
    if (pbVar21 == (byte *)0x0) {
LAB_00110e3e:
      __assert_fail("data != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_tcp.c"
                    ,0x389,"int test_object_format_uint(const char *)");
    }
    iVar2 = __ok((uint)(mp_type_hint[*pbVar21] == MP_ARRAY),"reply data is array");
    if (iVar2 == 0) {
      main_cold_125();
    }
    bVar1 = *pbVar21;
    if ((bVar1 & 0x40) == 0) {
      pbVar25 = pbVar21 + 1;
      uVar5 = bVar1 & 0xf;
    }
    else if ((bVar1 & 1) == 0) {
      pbVar25 = pbVar21 + 3;
      uVar5 = (uint)(ushort)(*(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8);
    }
    else {
      uVar5 = *(uint *)(pbVar21 + 1);
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      pbVar25 = pbVar21 + 5;
    }
    iVar2 = __ok((uint)(uVar5 == 1),"reply data array size is 1");
    if (iVar2 == 0) {
      main_cold_126();
    }
    iVar2 = __ok((uint)(mp_type_hint[*pbVar25] == MP_BOOL),"result is boolean");
    if (iVar2 == 0) {
      main_cold_127();
    }
    iVar2 = 1;
    pmVar24 = (mp_type *)&stdout;
    if (*pbVar25 != 0xc3) {
      if (*pbVar25 != 0xc2) {
LAB_00110e5d:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                      ,0x8a4,"_Bool mp_decode_bool(const char **)");
      }
      iVar2 = 0;
    }
    iVar2 = __ok(iVar2,"result is true");
    if (iVar2 == 0) {
      main_cold_128();
    }
    tnt_reply_free(ptVar13);
    __space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fprintf(_stdout,"*** verify %d response: done ***",uVar20);
    fputc(10,_stdout);
    uVar5 = (int)uVar20 + 1;
    uVar20 = (ulong)uVar5;
    if (uVar5 == 5) {
      tnt_close(ptVar7);
      tnt_stream_free(ptVar7);
      __space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fprintf(_stdout,"*** %s: done ***","test_object_format_uint");
      fputc(10,_stdout);
      check_plan();
      iVar2 = check_plan();
      return iVar2;
    }
  } while( true );
LAB_00110ddf:
  uVar5 = (uint)pbVar21;
  main_cold_118();
LAB_00110de4:
  main_cold_122();
LAB_00110732:
  iVar2 = __ok(uVar5,"Received response from server");
  if (iVar2 != 0) goto LAB_0011078c;
  main_cold_123();
  goto LAB_00110e02;
}

Assistant:

int main() {
	plan(11);

	char uri[128] = {0};
	snprintf(uri, 128, "test:test@%s", getenv("LISTEN"));

	test_connect_tcp(uri);
	test_object();
	test_request_01(uri);
	test_request_02(uri);
	test_request_03(uri);
	test_request_04(uri);
	test_request_05(uri);
	test_msgpack_array_iter();
	test_msgpack_mapa_iter();
	test_pushes(uri);
	test_object_format_uint(uri);

	return check_plan();
}